

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::StringUpperLowerMethod::~StringUpperLowerMethod(StringUpperLowerMethod *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine(&this->super_SimpleSystemSubroutine);
  operator_delete(this,0x68);
  return;
}

Assistant:

StringUpperLowerMethod(const Builtins& builtins, KnownSystemName knownNameId, bool upper) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, 0, {}, builtins.stringType,
                               true),
        upper(upper) {}